

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O0

char16 * __thiscall
FunctionJITTimeInfo::GetDebugNumberSet(FunctionJITTimeInfo *this,wchar (*bufferToWriteTo) [42])

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar7;
  int len;
  wchar (*bufferToWriteTo_local) [42];
  FunctionJITTimeInfo *this_local;
  
  uVar3 = GetSourceContextId(this);
  uVar4 = GetLocalFunctionId(this);
  this_00 = GetBody(this);
  uVar5 = JITTimeFunctionBody::GetFunctionNumber(this_00);
  iVar6 = swprintf_s((char16_t_conflict *)bufferToWriteTo,0x2a,
                     (char16_t_conflict *)L" (#%d.%u), #%u",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  if (iVar6 < 9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x1ea,"(len > 8)","len > 8");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return *bufferToWriteTo;
}

Assistant:

char16*
FunctionJITTimeInfo::GetDebugNumberSet(wchar(&bufferToWriteTo)[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE]) const
{
    // (#%u.%u), #%u --> (source file Id . function Id) , function Number
    int len = swprintf_s(bufferToWriteTo, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u(" (#%d.%u), #%u"),
        (int)GetSourceContextId(), GetLocalFunctionId(), GetBody()->GetFunctionNumber());
    Assert(len > 8);
    return bufferToWriteTo;
}